

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O3

UnicodeString * __thiscall icu_63::LocaleKey::prefix(LocaleKey *this,UnicodeString *result)

{
  UnicodeString temp;
  UChar buffer [64];
  UnicodeString UStack_d8;
  UChar local_98 [64];
  
  if (this->_kind != 0xffffffff) {
    uprv_itou_63(local_98,0x40,this->_kind,10,0);
    UnicodeString::UnicodeString(&UStack_d8,local_98);
    if (-1 < UStack_d8.fUnion.fStackFields.fLengthAndFlags) {
      UStack_d8.fUnion.fFields.fLength = (int)UStack_d8.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(result,&UStack_d8,0,UStack_d8.fUnion.fFields.fLength);
    UnicodeString::~UnicodeString(&UStack_d8);
  }
  return result;
}

Assistant:

UnicodeString&
LocaleKey::prefix(UnicodeString& result) const {
    if (_kind != KIND_ANY) {
        UChar buffer[64];
        uprv_itou(buffer, 64, _kind, 10, 0);
        UnicodeString temp(buffer);
        result.append(temp);
    }
    return result;
}